

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O2

void __thiscall opengv::absolute_pose::modules::Epnp::choose_control_points(Epnp *this)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int j_1;
  double *pdVar3;
  double *pdVar4;
  ulong *puVar5;
  long lVar6;
  double (*padVar7) [3];
  ulong uVar8;
  long lVar9;
  double *pdVar10;
  int j_2;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  MatrixXd Ut;
  MatrixXd D;
  MatrixXd PW0tPW0;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *local_268;
  MatrixXd PW0;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  undefined1 extraout_var [56];
  
  this->cws[0][2] = 0.0;
  this->cws[0][0] = 0.0;
  this->cws[0][1] = 0.0;
  uVar2 = this->number_of_correspondences;
  pdVar3 = this->pws;
  for (uVar8 = 0; uVar8 != (~((int)uVar2 >> 0x1f) & uVar2); uVar8 = uVar8 + 1) {
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      this->cws[0][lVar9] = pdVar3[lVar9] + this->cws[0][lVar9];
    }
    pdVar3 = pdVar3 + 3;
  }
  for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
    this->cws[0][lVar9] = this->cws[0][lVar9] / (double)(int)uVar2;
  }
  SVD.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.m_matrixU.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)
       CONCAT44(SVD.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data._4_4_,3);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&PW0,&this->number_of_correspondences,(int *)&SVD);
  uVar2 = this->number_of_correspondences;
  pdVar3 = this->pws;
  pdVar4 = PW0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  for (uVar8 = 0; uVar8 != (~((int)uVar2 >> 0x1f) & uVar2); uVar8 = uVar8 + 1) {
    pdVar10 = pdVar4;
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      *pdVar10 = pdVar3[lVar9] - this->cws[0][lVar9];
      pdVar10 = pdVar10 + PW0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_rows;
    }
    pdVar3 = pdVar3 + 3;
    pdVar4 = pdVar4 + 1;
  }
  SVD.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.m_matrixU.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = (double *)&PW0
  ;
  SVD.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.m_matrixU.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = (Index)&PW0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&PW0tPW0,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)&SVD);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD(&SVD,&PW0tPW0,0x14);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&D,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &SVD.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_singularValues);
  local_268 = &SVD;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&Ut,
             (DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_268);
  padVar7 = this->cws;
  lVar11 = 0;
  for (lVar9 = 1; padVar7 = padVar7 + 1, lVar9 != 4; lVar9 = lVar9 + 1) {
    auVar12._0_8_ =
         D.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         [lVar9 + -1] / (double)this->number_of_correspondences;
    auVar12._8_8_ = 0;
    if (auVar12._0_8_ < 0.0) {
      auVar13._0_8_ = sqrt(auVar12._0_8_);
      auVar13._8_56_ = extraout_var;
      auVar12 = auVar13._0_16_;
    }
    else {
      auVar12 = vsqrtsd_avx(auVar12,auVar12);
    }
    puVar5 = (ulong *)((long)Ut.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data + lVar11);
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *puVar5;
      puVar5 = puVar5 + Ut.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_rows;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = this->cws[0][lVar6];
      auVar1 = vfmadd213sd_fma(auVar14,auVar12,auVar1);
      (*padVar7)[lVar6] = auVar1._0_8_;
    }
    lVar11 = lVar11 + 8;
  }
  Eigen::internal::handmade_aligned_free
            (Ut.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (D.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&SVD);
  Eigen::internal::handmade_aligned_free
            (PW0tPW0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
  Eigen::internal::handmade_aligned_free
            (PW0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::choose_control_points(void)
{
  // Take C0 as the reference points centroid:
  cws[0][0] = cws[0][1] = cws[0][2] = 0;
  for(int i = 0; i < number_of_correspondences; i++)
    for(int j = 0; j < 3; j++)
      cws[0][j] += pws[3 * i + j];

  for(int j = 0; j < 3; j++)
    cws[0][j] /= number_of_correspondences;


  // Take C1, C2, and C3 from PCA on the reference points:
  Eigen::MatrixXd PW0(number_of_correspondences,3);

  for(int i = 0; i < number_of_correspondences; i++)
    for(int j = 0; j < 3; j++)
      PW0(i,j) = pws[3 * i + j] - cws[0][j];

  Eigen::MatrixXd PW0tPW0 = PW0.transpose() * PW0;
  Eigen::JacobiSVD< Eigen::MatrixXd > SVD(
      PW0tPW0,
      Eigen::ComputeFullV | Eigen::ComputeFullU );
  Eigen::MatrixXd D = SVD.singularValues();
  Eigen::MatrixXd Ut = SVD.matrixU().transpose();

  for(int i = 1; i < 4; i++)
  {
    double k = sqrt(D(i - 1,0) / number_of_correspondences);
    for(int j = 0; j < 3; j++)
      cws[i][j] = cws[0][j] + k * Ut((i - 1),j);
  }
}